

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

string * __thiscall
el::base::utils::OS::getBashOutput_abi_cxx11_(string *__return_storage_ptr__,OS *this,char *command)

{
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  char hBuff [4096];
  undefined8 uStack_1030;
  char acStack_1028 [4104];
  
  if (this != (OS *)0x0) {
    uStack_1030 = 0x15a1ea;
    __stream = popen((char *)this,"r");
    if (__stream != (FILE *)0x0) {
      uStack_1030 = 0x15a205;
      pcVar1 = fgets(acStack_1028,0x1000,__stream);
      uStack_1030 = 0x15a210;
      pclose(__stream);
      if (pcVar1 != (char *)0x0) {
        uStack_1030 = 0x15a21d;
        sVar2 = strlen(acStack_1028);
        if (acStack_1028[sVar2 - 1] == '\n') {
          acStack_1028[sVar2 - 1] = '\0';
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        uStack_1030 = 0x15a23c;
        sVar2 = strlen(acStack_1028);
        uStack_1030 = 0x15a24b;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,acStack_1028,acStack_1028 + sVar2);
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

const std::string OS::getBashOutput(const char* command) {
#if (ELPP_OS_UNIX && !ELPP_OS_ANDROID && !ELPP_CYGWIN)
  if (command == nullptr) {
    return std::string();
  }
  FILE* proc = nullptr;
  if ((proc = popen(command, "r")) == nullptr) {
    ELPP_INTERNAL_ERROR("\nUnable to run command [" << command << "]", true);
    return std::string();
  }
  char hBuff[4096];
  if (fgets(hBuff, sizeof(hBuff), proc) != nullptr) {
    pclose(proc);
    if (hBuff[strlen(hBuff) - 1] == '\n') {
      hBuff[strlen(hBuff) - 1] = '\0';
    }
    return std::string(hBuff);
  } else {
    pclose(proc);
  }
  return std::string();
#else
  ELPP_UNUSED(command);
  return std::string();
#endif  // (ELPP_OS_UNIX && !ELPP_OS_ANDROID && !ELPP_CYGWIN)
}